

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestGlobalVC.cxx
# Opt level: O0

void __thiscall
cmCTestGlobalVC::DoRevision
          (cmCTestGlobalVC *this,Revision *revision,
          vector<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_> *changes)

{
  cmCTest *this_00;
  undefined8 __s;
  __type _Var1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  char *pcVar5;
  reference pvVar6;
  reference pCVar7;
  undefined4 extraout_var;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestVC::File,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestVC::File>_>_>
  *this_01;
  mapped_type *pmVar8;
  Revision *local_2e8;
  File *file;
  string local_280;
  undefined1 local_260 [8];
  string name;
  string local_238;
  undefined1 local_218 [8];
  string dir;
  char *local;
  Change *c;
  const_iterator __end1;
  const_iterator __begin1;
  vector<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_> *__range1;
  Revision *rev;
  ostringstream local_198 [8];
  ostringstream cmCTestLog_msg;
  vector<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_> *changes_local;
  Revision *revision_local;
  cmCTestGlobalVC *this_local;
  
  _Var1 = std::operator==(&revision->Rev,&this->OldRevision);
  if (_Var1) {
    cmCTestVC::Revision::operator=(&this->PriorRev,revision);
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_198);
    poVar4 = std::operator<<((ostream *)local_198,".");
    std::ostream::operator<<(poVar4,std::flush<char,std::char_traits<char>>);
    this_00 = (this->super_cmCTestVC).CTest;
    std::__cxx11::ostringstream::str();
    pcVar5 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(this_00,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestGlobalVC.cxx"
                 ,0x23,pcVar5,false);
    std::__cxx11::string::~string((string *)&rev);
    std::__cxx11::ostringstream::~ostringstream(local_198);
    std::__cxx11::list<cmCTestVC::Revision,_std::allocator<cmCTestVC::Revision>_>::push_back
              (&this->Revisions,revision);
    pvVar6 = std::__cxx11::list<cmCTestVC::Revision,_std::allocator<cmCTestVC::Revision>_>::back
                       (&this->Revisions);
    poVar4 = std::operator<<((this->super_cmCTestVC).Log,"Found revision ");
    poVar4 = std::operator<<(poVar4,(string *)pvVar6);
    poVar4 = std::operator<<(poVar4,"\n");
    poVar4 = std::operator<<(poVar4,"  author = ");
    poVar4 = std::operator<<(poVar4,(string *)&pvVar6->Author);
    poVar4 = std::operator<<(poVar4,"\n");
    poVar4 = std::operator<<(poVar4,"  date = ");
    poVar4 = std::operator<<(poVar4,(string *)&pvVar6->Date);
    std::operator<<(poVar4,"\n");
    __end1 = std::vector<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_>::begin
                       (changes);
    c = (Change *)
        std::vector<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_>::end(changes)
    ;
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<const_cmCTestGlobalVC::Change_*,_std::vector<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_>_>
                                       *)&c), bVar2) {
      pCVar7 = __gnu_cxx::
               __normal_iterator<const_cmCTestGlobalVC::Change_*,_std::vector<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_>_>
               ::operator*(&__end1);
      iVar3 = (*(this->super_cmCTestVC)._vptr_cmCTestVC[8])(this,&pCVar7->Path);
      pcVar5 = (char *)CONCAT44(extraout_var,iVar3);
      dir.field_2._8_8_ = pcVar5;
      if (pcVar5 != (char *)0x0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_238,pcVar5,(allocator<char> *)(name.field_2._M_local_buf + 0xf))
        ;
        cmsys::SystemTools::GetFilenamePath((string *)local_218,&local_238);
        std::__cxx11::string::~string((string *)&local_238);
        std::allocator<char>::~allocator((allocator<char> *)(name.field_2._M_local_buf + 0xf));
        __s = dir.field_2._8_8_;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_280,(char *)__s,(allocator<char> *)((long)&file + 7));
        cmsys::SystemTools::GetFilenameName((string *)local_260,&local_280);
        std::__cxx11::string::~string((string *)&local_280);
        std::allocator<char>::~allocator((allocator<char> *)((long)&file + 7));
        this_01 = &std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGlobalVC::Directory,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGlobalVC::Directory>_>_>
                   ::operator[](&this->Dirs,(key_type *)local_218)->
                   super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestVC::File,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestVC::File>_>_>
        ;
        pmVar8 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestVC::File,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestVC::File>_>_>
                 ::operator[](this_01,(key_type *)local_260);
        if (pmVar8->Rev == (Revision *)0x0) {
          local_2e8 = &this->PriorRev;
        }
        else {
          local_2e8 = pmVar8->Rev;
        }
        pmVar8->PriorRev = local_2e8;
        pmVar8->Rev = pvVar6;
        poVar4 = std::operator<<((this->super_cmCTestVC).Log,"  ");
        poVar4 = std::operator<<(poVar4,pCVar7->Action);
        poVar4 = std::operator<<(poVar4," ");
        poVar4 = std::operator<<(poVar4,(char *)dir.field_2._8_8_);
        poVar4 = std::operator<<(poVar4," ");
        std::operator<<(poVar4,"\n");
        std::__cxx11::string::~string((string *)local_260);
        std::__cxx11::string::~string((string *)local_218);
      }
      __gnu_cxx::
      __normal_iterator<const_cmCTestGlobalVC::Change_*,_std::vector<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_>_>
      ::operator++(&__end1);
    }
  }
  return;
}

Assistant:

void cmCTestGlobalVC::DoRevision(Revision const& revision,
                                 std::vector<Change> const& changes)
{
  // Ignore changes in the old revision.
  if (revision.Rev == this->OldRevision) {
    this->PriorRev = revision;
    return;
  }

  // Indicate we found a revision.
  cmCTestLog(this->CTest, HANDLER_OUTPUT, "." << std::flush);

  // Store the revision.
  this->Revisions.push_back(revision);

  // Report this revision.
  Revision const& rev = this->Revisions.back();
  /* clang-format off */
  this->Log << "Found revision " << rev.Rev << "\n"
            << "  author = " << rev.Author << "\n"
            << "  date = " << rev.Date << "\n";
  /* clang-format on */

  // Update information about revisions of the changed files.
  for (Change const& c : changes) {
    if (const char* local = this->LocalPath(c.Path)) {
      std::string dir = cmSystemTools::GetFilenamePath(local);
      std::string name = cmSystemTools::GetFilenameName(local);
      File& file = this->Dirs[dir][name];
      file.PriorRev = file.Rev ? file.Rev : &this->PriorRev;
      file.Rev = &rev;
      this->Log << "  " << c.Action << " " << local << " "
                << "\n";
    }
  }
}